

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::changeElement
          (SPxSolverBase<double> *this,int i,int j,double *val,bool scale)

{
  if (-1 < (j | i)) {
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
    SPxLPBase<double>::changeElement(&this->super_SPxLPBase<double>,i,j,val,scale);
    if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
      SPxBasisBase<double>::changedElement(&this->super_SPxBasisBase<double>,i,j);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeElement(int i, int j, const R& val, bool scale)
{
   if(i < 0 || j < 0)
      return;

   forceRecompNonbasicValue();

   SPxLPBase<R>::changeElement(i, j, val, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      SPxBasisBase<R>::changedElement(i, j);

   unInit();
}